

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int jas_stream_copy(jas_stream_t *out,jas_stream_t *in,int n)

{
  byte *pbVar1;
  uchar *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = n;
  if (n != 0) {
    do {
      uVar4 = 0xffffffff;
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar5 = in->cnt_;
          in->cnt_ = iVar5 + -1;
          if (iVar5 < 1) {
            uVar4 = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar1 = in->ptr_;
            in->ptr_ = pbVar1 + 1;
            uVar4 = (uint)*pbVar1;
          }
        }
        else {
          in->flags_ = in->flags_ | 4;
        }
      }
      if (uVar4 == 0xffffffff) {
        if (n < 0) {
          return (in->flags_ << 0x1e) >> 0x1f;
        }
        return -1;
      }
      if ((out->flags_ & 7U) != 0) {
        return -1;
      }
      if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
        out->flags_ = out->flags_ | 4;
        return -1;
      }
      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
      iVar5 = out->cnt_;
      out->cnt_ = iVar5 + -1;
      if (iVar5 < 1) {
        iVar5 = jas_stream_flushbuf(out,uVar4 & 0xff);
        if (iVar5 == -1) {
          return -1;
        }
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        puVar2 = out->ptr_;
        out->ptr_ = puVar2 + 1;
        *puVar2 = (uchar)uVar4;
      }
      bVar3 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar3 || n < 0);
  }
  return 0;
}

Assistant:

int jas_stream_copy(jas_stream_t *out, jas_stream_t *in, int n)
{
	int all;
	int c;
	int m;

	all = (n < 0) ? 1 : 0;

	m = n;
	while (all || m > 0) {
		if ((c = jas_stream_getc_macro(in)) == EOF) {
			/* The next character of input could not be read. */
			/* Return with an error if an I/O error occured
			  (not including EOF) or if an explicit copy count
			  was specified. */
			return (!all || jas_stream_error(in)) ? (-1) : 0;
		}
		if (jas_stream_putc_macro(out, c) == EOF) {
			return -1;
		}
		--m;
	}
	return 0;
}